

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,ListEditQual v)

{
  allocator local_1b;
  allocator local_1a;
  allocator local_19;
  allocator local_18;
  allocator local_17;
  allocator local_16;
  allocator local_15;
  int local_14;
  string *psStack_10;
  ListEditQual v_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_15);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else if (local_14 == 1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"append",&local_16);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_16);
  }
  else if (local_14 == 2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"add",&local_17);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_17);
  }
  else if (local_14 == 3) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"delete",&local_18);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_18);
  }
  else if (local_14 == 4) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"prepend",&local_19);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else if (local_14 == 5) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"order",&local_1a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"[[Invalid ListEditQual value]]",&local_1b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1b);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::ListEditQual v) {
  if (v == tinyusdz::ListEditQual::ResetToExplicit) {
    return "";  // unqualified
  } else if (v == tinyusdz::ListEditQual::Append) {
    return "append";
  } else if (v == tinyusdz::ListEditQual::Add) {
    return "add";
  } else if (v == tinyusdz::ListEditQual::Delete) {
    return "delete";
  } else if (v == tinyusdz::ListEditQual::Prepend) {
    return "prepend";
  } else if (v == tinyusdz::ListEditQual::Order) {
    return "order";
  }

  return "[[Invalid ListEditQual value]]";
}